

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

void helics::detail::convertFromBinary(byte *data,complex<double> *val)

{
  undefined8 *in_RSI;
  byte *in_RDI;
  
  *in_RSI = *(undefined8 *)(in_RDI + 8);
  in_RSI[1] = *(undefined8 *)(in_RDI + 0x10);
  if ((*in_RDI & 1) != 0) {
    checks::swapBytes<8ul>(in_RDI);
    checks::swapBytes<8ul>(in_RDI);
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, std::complex<double>& val)
{
    // https://en.cppreference.com/w/cpp/numeric/complex
    //  the layout used here is guaranteed by the standard
    std::memcpy(&reinterpret_cast<double(&)[2]>(val)[0], data + 8, 8);
    std::memcpy(&reinterpret_cast<double(&)[2]>(val)[1], data + 16, 8);
    if ((data[0] & endianMask) != littleEndianCode) {
        checks::swapBytes<8>(reinterpret_cast<std::byte*>(&val));
        checks::swapBytes<8>(reinterpret_cast<std::byte*>(&val) + 8);
    }
}